

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

void __thiscall Js::ConfigFlagsTable::SetAllParentFlagsAsDefaultValue(ConfigFlagsTable *this)

{
  code *pcVar1;
  bool bVar2;
  Boolean value;
  Flag flag;
  FlagTypes FVar3;
  undefined4 *puVar4;
  int local_14;
  Boolean defaultParentValue;
  Flag currentFlag;
  int i;
  ConfigFlagsTable *this_local;
  
  local_14 = 0;
  do {
    if (0x1d5 < local_14) {
      return;
    }
    flag = (Flag)local_14;
    bVar2 = IsParentFlag(this,flag);
    if (bVar2) {
      FVar3 = GetFlagType(flag);
      if (FVar3 != FlagBoolean) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                    ,0x1c4,"(this->GetFlagType(currentFlag) == FlagBoolean)",
                                    "only supporting boolean flags as parent flags");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      value = GetDefaultValueAsBoolean(this,flag);
      SetAsBoolean(this,flag,value);
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void
    ConfigFlagsTable::SetAllParentFlagsAsDefaultValue()
    {
        for (int i = 0; i < FlagCount; i++)
        {
            Flag currentFlag = (Flag) i;
            if (this->IsParentFlag(currentFlag))
            {
                // only supporting Boolean for now
                AssertMsg(this->GetFlagType(currentFlag) == FlagBoolean, "only supporting boolean flags as parent flags");

                Boolean defaultParentValue = this->GetDefaultValueAsBoolean(currentFlag);
                this->SetAsBoolean(currentFlag, defaultParentValue);
            }
        }
    }